

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O1

uint32_t __thiscall
icu_63::CollationDataBuilder::encodeExpansion32
          (CollationDataBuilder *this,int32_t *newCE32s,int32_t length,UErrorCode *errorCode)

{
  int iVar1;
  int32_t iVar2;
  int32_t *piVar3;
  UBool UVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int32_t *piVar10;
  ulong uVar11;
  bool bVar12;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  iVar1 = (this->ce32s).count;
  uVar5 = iVar1 - length;
  uVar6 = uVar5 >> 0x1f;
  if (-1 < (int)uVar5) {
    piVar3 = (this->ce32s).elements;
    uVar9 = (ulong)uVar5;
    uVar11 = 0;
    piVar10 = piVar3;
    do {
      iVar7 = 0;
      if ((long)uVar11 < (long)iVar1 && 0 < iVar1) {
        iVar7 = piVar3[uVar11];
      }
      if (*newCE32s == iVar7) {
        if (0x7ffff < uVar11) {
          *errorCode = U_BUFFER_OVERFLOW_ERROR;
          uVar5 = 0;
          break;
        }
        bVar12 = length == 1;
        if (length != 1) {
          uVar8 = 1;
          do {
            iVar7 = 0;
            if ((int)uVar11 + (int)uVar8 < iVar1 && 0 < iVar1) {
              iVar7 = piVar10[uVar8];
            }
            if (iVar7 != newCE32s[uVar8]) goto LAB_002330df;
            uVar8 = uVar8 + 1;
            bVar12 = (uint)length == uVar8;
          } while (!bVar12);
        }
        uVar5 = (int)uVar11 << 0xd | length << 8 | 0xc5;
LAB_002330df:
        if (bVar12) break;
      }
      bVar12 = uVar9 <= uVar11;
      uVar11 = uVar11 + 1;
      uVar6 = (uint)bVar12;
      piVar10 = piVar10 + 1;
    } while (uVar11 != (iVar1 - length) + 1);
  }
  if (uVar6 != 0) {
    if (iVar1 < 0x80000) {
      if (0 < length) {
        uVar11 = 0;
        do {
          iVar2 = newCE32s[uVar11];
          iVar7 = (this->ce32s).count;
          if (((-2 < iVar7) && (iVar7 < (this->ce32s).capacity)) ||
             (UVar4 = UVector32::expandCapacity(&this->ce32s,iVar7 + 1,errorCode), UVar4 != '\0')) {
            (this->ce32s).elements[(this->ce32s).count] = iVar2;
            piVar3 = &(this->ce32s).count;
            *piVar3 = *piVar3 + 1;
          }
          uVar11 = uVar11 + 1;
        } while ((uint)length != uVar11);
      }
      uVar5 = length << 8 | iVar1 << 0xd | 0xc5;
    }
    else {
      *errorCode = U_BUFFER_OVERFLOW_ERROR;
      uVar5 = 0;
    }
  }
  return uVar5;
}

Assistant:

uint32_t
CollationDataBuilder::encodeExpansion32(const int32_t newCE32s[], int32_t length,
                                        UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    // See if this sequence of CE32s has already been stored.
    int32_t first = newCE32s[0];
    int32_t ce32sMax = ce32s.size() - length;
    for(int32_t i = 0; i <= ce32sMax; ++i) {
        if(first == ce32s.elementAti(i)) {
            if(i > Collation::MAX_INDEX) {
                errorCode = U_BUFFER_OVERFLOW_ERROR;
                return 0;
            }
            for(int32_t j = 1;; ++j) {
                if(j == length) {
                    return Collation::makeCE32FromTagIndexAndLength(
                            Collation::EXPANSION32_TAG, i, length);
                }
                if(ce32s.elementAti(i + j) != newCE32s[j]) { break; }
            }
        }
    }
    // Store the new sequence.
    int32_t i = ce32s.size();
    if(i > Collation::MAX_INDEX) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return 0;
    }
    for(int32_t j = 0; j < length; ++j) {
        ce32s.addElement(newCE32s[j], errorCode);
    }
    return Collation::makeCE32FromTagIndexAndLength(Collation::EXPANSION32_TAG, i, length);
}